

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O0

void __thiscall btRotationalLimitMotor2::btRotationalLimitMotor2(btRotationalLimitMotor2 *this)

{
  btRotationalLimitMotor2 *this_local;
  
  this->m_loLimit = 1.0;
  this->m_hiLimit = -1.0;
  this->m_bounce = 0.0;
  this->m_stopERP = 0.2;
  this->m_stopCFM = 0.0;
  this->m_motorERP = 0.9;
  this->m_motorCFM = 0.0;
  this->m_enableMotor = false;
  this->m_targetVelocity = 0.0;
  this->m_maxMotorForce = 0.1;
  this->m_servoMotor = false;
  this->m_servoTarget = 0.0;
  this->m_enableSpring = false;
  this->m_springStiffness = 0.0;
  this->m_springStiffnessLimited = false;
  this->m_springDamping = 0.0;
  this->m_springDampingLimited = false;
  this->m_equilibriumPoint = 0.0;
  this->m_currentLimitError = 0.0;
  this->m_currentLimitErrorHi = 0.0;
  this->m_currentPosition = 0.0;
  this->m_currentLimit = 0;
  return;
}

Assistant:

btRotationalLimitMotor2()
	{
		m_loLimit                = 1.0f;
		m_hiLimit                = -1.0f;
		m_bounce                 = 0.0f;
		m_stopERP                = 0.2f;
		m_stopCFM                = 0.f;
		m_motorERP               = 0.9f;
		m_motorCFM               = 0.f;
		m_enableMotor            = false;
		m_targetVelocity         = 0;
		m_maxMotorForce          = 0.1f;
		m_servoMotor             = false;
		m_servoTarget            = 0;
		m_enableSpring           = false;
		m_springStiffness        = 0;
		m_springStiffnessLimited = false;
		m_springDamping          = 0;
		m_springDampingLimited   = false;
		m_equilibriumPoint       = 0;

		m_currentLimitError   = 0;
		m_currentLimitErrorHi = 0;
		m_currentPosition     = 0;
		m_currentLimit        = 0;
	}